

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.h
# Opt level: O1

int secp256k1_musig_aggnonce_serialize
              (secp256k1_context *ctx,uchar *out66,secp256k1_musig_aggnonce *nonce)

{
  int iVar1;
  secp256k1_ge *ge;
  long lVar2;
  secp256k1_ge ges [2];
  secp256k1_ge asStack_e8 [2];
  
  ge = asStack_e8;
  if (ctx == (secp256k1_context *)0x0) {
    secp256k1_musig_aggnonce_serialize_cold_2();
  }
  else if (out66 != (uchar *)0x0) {
    out66[0x30] = '\0';
    out66[0x31] = '\0';
    out66[0x32] = '\0';
    out66[0x33] = '\0';
    out66[0x34] = '\0';
    out66[0x35] = '\0';
    out66[0x36] = '\0';
    out66[0x37] = '\0';
    out66[0x38] = '\0';
    out66[0x39] = '\0';
    out66[0x3a] = '\0';
    out66[0x3b] = '\0';
    out66[0x3c] = '\0';
    out66[0x3d] = '\0';
    out66[0x3e] = '\0';
    out66[0x3f] = '\0';
    out66[0x20] = '\0';
    out66[0x21] = '\0';
    out66[0x22] = '\0';
    out66[0x23] = '\0';
    out66[0x24] = '\0';
    out66[0x25] = '\0';
    out66[0x26] = '\0';
    out66[0x27] = '\0';
    out66[0x28] = '\0';
    out66[0x29] = '\0';
    out66[0x2a] = '\0';
    out66[0x2b] = '\0';
    out66[0x2c] = '\0';
    out66[0x2d] = '\0';
    out66[0x2e] = '\0';
    out66[0x2f] = '\0';
    out66[0x10] = '\0';
    out66[0x11] = '\0';
    out66[0x12] = '\0';
    out66[0x13] = '\0';
    out66[0x14] = '\0';
    out66[0x15] = '\0';
    out66[0x16] = '\0';
    out66[0x17] = '\0';
    out66[0x18] = '\0';
    out66[0x19] = '\0';
    out66[0x1a] = '\0';
    out66[0x1b] = '\0';
    out66[0x1c] = '\0';
    out66[0x1d] = '\0';
    out66[0x1e] = '\0';
    out66[0x1f] = '\0';
    out66[0] = '\0';
    out66[1] = '\0';
    out66[2] = '\0';
    out66[3] = '\0';
    out66[4] = '\0';
    out66[5] = '\0';
    out66[6] = '\0';
    out66[7] = '\0';
    out66[8] = '\0';
    out66[9] = '\0';
    out66[10] = '\0';
    out66[0xb] = '\0';
    out66[0xc] = '\0';
    out66[0xd] = '\0';
    out66[0xe] = '\0';
    out66[0xf] = '\0';
    out66[0x40] = '\0';
    out66[0x41] = '\0';
    if (nonce != (secp256k1_musig_aggnonce *)0x0) {
      iVar1 = secp256k1_musig_aggnonce_load(ctx,asStack_e8,nonce);
      if (iVar1 == 0) {
        return 0;
      }
      lVar2 = 0;
      do {
        secp256k1_musig_ge_serialize_ext(out66 + lVar2,ge);
        lVar2 = lVar2 + 0x21;
        ge = ge + 1;
      } while (lVar2 == 0x21);
      return 1;
    }
  }
  secp256k1_musig_aggnonce_serialize_cold_1();
  return 0;
}

Assistant:

int secp256k1_musig_aggnonce_serialize(const secp256k1_context* ctx, unsigned char *out66, const secp256k1_musig_aggnonce* nonce) {
    secp256k1_ge ges[2];
    int i;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(out66 != NULL);
    memset(out66, 0, 66);
    ARG_CHECK(nonce != NULL);

    if (!secp256k1_musig_aggnonce_load(ctx, ges, nonce)) {
        return 0;
    }
    for (i = 0; i < 2; i++) {
        secp256k1_musig_ge_serialize_ext(&out66[33*i], &ges[i]);
    }
    return 1;
}